

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::ScriptSession::eval
          (ConstantValue *__return_storage_ptr__,ScriptSession *this,string_view text)

{
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  SyntaxKind kind;
  SyntaxNode *syntax;
  ValueSymbol *symbol;
  size_type sVar1;
  pointer ppMVar2;
  undefined8 uVar3;
  bool bVar4;
  DataDeclarationSyntax *syntax_00;
  long lVar5;
  Expression *this_01;
  CompilationUnitSyntax *pCVar6;
  ExpressionSyntax *expr;
  StatementSyntax *stmt;
  logic_error *this_02;
  long *plVar7;
  pointer pDVar8;
  pointer pvVar9;
  element_type *peVar10;
  char *in_R9;
  long lVar11;
  string_view name;
  string_view path;
  string_view text_00;
  SmallVector<const_slang::ast::ValueSymbol_*,_5UL> symbols;
  ConstantValue initial;
  undefined1 local_168 [24];
  char aacStack_150 [5] [8];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [56];
  undefined1 local_c0 [32];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_a0;
  string local_78;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_c0._16_8_ = (pointer)0x0;
  local_c0._24_8_ = (long)"OVERVIEW: {}\n\n" + 0xe;
  name._M_str = (char *)0x6;
  name._M_len = (size_t)text._M_str;
  path._M_str = in_R9;
  path._M_len = (size_t)"source";
  text_00._M_str = (char *)text._M_len;
  text_00._M_len = (size_t)local_168;
  slang::syntax::SyntaxTree::fromText(text_00,name,path);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
            ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
              *)&this->syntaxTrees,(shared_ptr<slang::syntax::SyntaxTree> *)local_168);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  syntax = ((this->syntaxTrees).
            super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           rootNode;
  kind = syntax->kind;
  if ((int)kind < 0x122) {
    if ((kind - FunctionDeclaration < 0x2b) &&
       ((0x40000000401U >> ((ulong)(kind - FunctionDeclaration) & 0x3f) & 1) != 0))
    goto LAB_00289977;
    if (kind == CompilationUnit) {
      pCVar6 = slang::syntax::SyntaxNode::as<slang::syntax::CompilationUnitSyntax>(syntax);
      sVar1 = (pCVar6->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              size_;
      if (sVar1 != 0) {
        ppMVar2 = (pCVar6->members).
                  super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
        lVar5 = 0;
        do {
          CompilationUnitSymbol::addMembers(this->scope,*(SyntaxNode **)((long)ppMVar2 + lVar5));
          lVar5 = lVar5 + 8;
        } while (sVar1 << 3 != lVar5);
      }
      goto LAB_00289986;
    }
    if (kind == DataDeclaration) {
      local_168._0_8_ = aacStack_150;
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_168._16_8_ = 5;
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(syntax);
      VariableSymbol::fromSyntax
                (&this->compilation,syntax_00,&this->scope->super_Scope,
                 (SmallVectorBase<const_slang::ast::ValueSymbol_*> *)local_168);
      uVar3 = local_168._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar5 = local_168._8_8_ << 3;
        lVar11 = 0;
        local_f8._24_8_ = __return_storage_ptr__;
        local_f8._32_8_ = this;
        do {
          symbol = *(ValueSymbol **)
                    ((((Diagnostics *)(uVar3 + 0x28))->super_SmallVector<slang::Diagnostic,_2UL>).
                     super_SmallVectorBase<slang::Diagnostic>.firstElement + lVar11 + -0x40);
          Scope::addMember(&(*(CompilationUnitSymbol **)(local_f8._32_8_ + 0x950))->super_Scope,
                           &symbol->super_Symbol);
          local_f8[0x10] = '\0';
          this_01 = DeclaredType::getInitializer(&symbol->declaredType);
          if (this_01 != (Expression *)0x0) {
            this_00 = (_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)(local_c0 + 0x20);
            Expression::eval((ConstantValue *)this_00,this_01,&this->evalContext);
            local_128._0_8_ = local_108;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ::_S_vtable._M_arr[(long)(char)local_a0._M_index + 1]._M_data)
                      ((anon_class_8_1_8991fb9c_conflict *)local_128,
                       (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        *)this_00);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(this_00);
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_58,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_108);
          EvalContext::createLocal(&this->evalContext,symbol,(ConstantValue *)&local_58);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_58);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_108);
          lVar11 = lVar11 + 8;
          __return_storage_ptr__ = (ConstantValue *)local_f8._24_8_;
        } while (lVar5 != lVar11);
      }
      *(__index_type *)&((pointer)((long)__return_storage_ptr__ + 0x20))->startLoc = '\0';
      if ((element_type *)local_168._0_8_ == (element_type *)aacStack_150) {
        return __return_storage_ptr__;
      }
      free((void *)local_168._0_8_);
      return __return_storage_ptr__;
    }
  }
  else if ((int)kind < 0x1b5) {
    if ((kind == ModuleDeclaration) || (kind == ParameterDeclarationStatement)) {
LAB_00289977:
      CompilationUnitSymbol::addMembers(this->scope,syntax);
      goto LAB_00289986;
    }
  }
  else if ((kind == TaskDeclaration) || (kind == TypedefDeclaration)) goto LAB_00289977;
  bVar4 = slang::syntax::ExpressionSyntax::isKind(kind);
  if (bVar4) {
    expr = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(syntax);
    evalExpression(__return_storage_ptr__,this,expr);
    return __return_storage_ptr__;
  }
  bVar4 = slang::syntax::StatementSyntax::isKind(syntax->kind);
  if (!bVar4) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    local_f8._40_8_ = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_f8 + 0x28),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ScriptSession.cpp"
               ,"");
    plVar7 = (long *)std::__cxx11::string::append(local_f8 + 0x28);
    local_128._0_8_ = *plVar7;
    pDVar8 = (pointer)(plVar7 + 2);
    if ((pointer)local_128._0_8_ == pDVar8) {
      local_128._16_8_ =
           (pDVar8->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_128._24_8_ = plVar7[3];
      local_128._0_8_ = (pointer)(local_128 + 0x10);
    }
    else {
      local_128._16_8_ =
           (pDVar8->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    local_128._8_8_ = plVar7[1];
    *plVar7 = (long)pDVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::to_string(&local_78,0x4e);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_c0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_78);
    plVar7 = (long *)std::__cxx11::string::append(local_c0 + 0x20);
    local_108._0_8_ = *plVar7;
    pvVar9 = (pointer)(plVar7 + 2);
    if ((pointer)local_108._0_8_ == pvVar9) {
      local_f8._0_8_ =
           *(undefined8 *)
            &(pvVar9->
             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             ).
             super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             ._M_u;
      local_f8._8_8_ = plVar7[3];
      local_108._0_8_ = (pointer)local_f8;
    }
    else {
      local_f8._0_8_ =
           *(undefined8 *)
            &(pvVar9->
             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             ).
             super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             .
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>
             ._M_u;
    }
    local_108._8_8_ = plVar7[1];
    *plVar7 = (long)pvVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_108);
    local_168._0_8_ = *plVar7;
    peVar10 = (element_type *)(plVar7 + 2);
    if ((element_type *)local_168._0_8_ == peVar10) {
      local_168._16_8_ = *(undefined8 *)peVar10;
      aacStack_150[0] = *(char (*) [8])(plVar7 + 3);
      local_168._0_8_ = (element_type *)(local_168 + 0x10);
    }
    else {
      local_168._16_8_ = *(undefined8 *)peVar10;
    }
    local_168._8_8_ = plVar7[1];
    *plVar7 = (long)peVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::logic_error::logic_error(this_02,(string *)local_168);
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  stmt = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(syntax);
  evalStatement(this,stmt);
LAB_00289986:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
  return (ConstantValue *)(pointer)__return_storage_ptr__;
}

Assistant:

ConstantValue ScriptSession::eval(string_view text) {
    syntaxTrees.emplace_back(SyntaxTree::fromText(text));

    const auto& node = syntaxTrees.back()->root();
    switch (node.kind) {
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::TypedefDeclaration:
            scope.addMembers(node);
            return nullptr;
        case SyntaxKind::DataDeclaration: {
            SmallVector<const ValueSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, node.as<DataDeclarationSyntax>(), scope,
                                       symbols);

            for (auto symbol : symbols) {
                scope.addMember(*symbol);

                ConstantValue initial;
                if (auto initializer = symbol->getInitializer())
                    initial = initializer->eval(evalContext);

                evalContext.createLocal(symbol, initial);
            }
            return nullptr;
        }
        case SyntaxKind::CompilationUnit:
            for (auto member : node.as<CompilationUnitSyntax>().members)
                scope.addMembers(*member);
            return nullptr;
        default:
            if (ExpressionSyntax::isKind(node.kind)) {
                return evalExpression(node.as<ExpressionSyntax>());
            }
            else if (StatementSyntax::isKind(node.kind)) {
                evalStatement(node.as<StatementSyntax>());
                return nullptr;
            }
            else {
                // If this throws, ScriptSession doesn't currently support whatever construct
                // you were trying to evaluate. Add support to the case above.
                ASSUME_UNREACHABLE;
            }
    }
}